

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::PyiGenerator::PrintImportForDescriptor
          (PyiGenerator *this,FileDescriptor *desc,
          flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *seen_aliases,bool *has_importlib)

{
  undefined1 auVar1 [16];
  PyiGenerator *pPVar2;
  bool bVar3;
  size_type __n;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar4;
  AlphaNum *pAVar5;
  char *extraout_RDX;
  AlphaNum *in_R9;
  string_view module_name_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view filename_00;
  string_view module_name;
  AlphaNum local_190;
  size_type local_160;
  PyiGenerator *local_158;
  string alias;
  string import_statement;
  string_view filename;
  AlphaNum local_100;
  AlphaNum local_d0;
  string module_name_owned;
  undefined1 local_80 [32];
  AlphaNum local_60;
  
  filename._M_str = (desc->name_->_M_dataplus)._M_p;
  filename._M_len = desc->name_->_M_string_length;
  filename_00._M_str = has_importlib;
  filename_00._M_len = (size_t)filename._M_str;
  local_158 = this;
  StrippedModuleName_abi_cxx11_(&module_name_owned,(python *)filename._M_len,filename_00);
  module_name._M_len = module_name_owned._M_string_length;
  module_name._M_str = module_name_owned._M_dataplus._M_p;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&module_name,'.',0xffffffffffffffff);
  local_190.piece_ = absl::lts_20250127::NullSafeStringView("_");
  local_160 = __n + 1;
  local_100.piece_ =
       std::basic_string_view<char,_std::char_traits<char>_>::substr
                 (&module_name,local_160,0xffffffffffffffff);
  pAVar5 = &local_100;
  absl::lts_20250127::StrCat_abi_cxx11_(&alias,(lts_20250127 *)&local_190,pAVar5,pAVar5);
  while( true ) {
    local_190.piece_ =
         (string_view)
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
         ::find<std::__cxx11::string>
                   ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                     *)seen_aliases,&alias);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::AssertNotDebugCapacity
              (&seen_aliases->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_100.piece_._M_str;
    local_100.piece_ = (string_view)(auVar1 << 0x40);
    bVar3 = absl::lts_20250127::container_internal::operator!=
                      ((iterator *)&local_190,(iterator *)&local_100);
    if (!bVar3) break;
    local_190.piece_ = absl::lts_20250127::NullSafeStringView("_1");
    absl::lts_20250127::StrAppend(&alias,&local_190);
  }
  module_name_00._M_str = extraout_RDX;
  module_name_00._M_len = (size_t)module_name._M_str;
  bVar3 = ContainsPythonKeyword((python *)module_name._M_len,module_name_00);
  pPVar2 = local_158;
  if (bVar3) {
    if (*has_importlib == false) {
      text._M_str = "import importlib\n";
      text._M_len = 0x11;
      io::Printer::Print<>(local_158->printer_,text);
      *has_importlib = true;
    }
    text_00._M_str = "$alias$ = importlib.import_module(\'$name$\')\n";
    text_00._M_len = 0x2c;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>>
              (pPVar2->printer_,text_00,(char (*) [6])0xffc218,&alias,(char (*) [5])0xd8d1e3,
               &module_name);
  }
  else {
    import_statement._M_dataplus._M_p = (pointer)&import_statement.field_2;
    import_statement._M_string_length = 0;
    import_statement.field_2._M_local_buf[0] = '\0';
    if (__n == 0xffffffffffffffff) {
      local_190.piece_ = absl::lts_20250127::NullSafeStringView("import ");
      local_100.piece_._M_str = module_name._M_str;
      local_100.piece_._M_len = module_name._M_len;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_d0,(lts_20250127 *)&local_190,&local_100,pAVar5);
      pAVar5 = &local_d0;
    }
    else {
      local_190.piece_ = absl::lts_20250127::NullSafeStringView("from ");
      local_100.piece_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr(&module_name,0,__n);
      local_d0.piece_ = absl::lts_20250127::NullSafeStringView(" import ");
      local_60.piece_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     (&module_name,local_160,0xffffffffffffffff);
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_80,(lts_20250127 *)&local_190,&local_100,&local_d0,&local_60,in_R9)
      ;
      pAVar5 = (AlphaNum *)local_80;
    }
    std::__cxx11::string::operator=((string *)&import_statement,(string *)pAVar5);
    std::__cxx11::string::~string((string *)pAVar5);
    text_01._M_str = "$statement$ as $alias$\n";
    text_01._M_len = 0x17;
    io::Printer::Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string>
              (pPVar2->printer_,text_01,(char (*) [10])"statement",&import_statement,
               (char (*) [6])0xffc218,&alias);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::
             operator[]<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)&pPVar2->import_map_,&filename);
    std::__cxx11::string::_M_assign((string *)pbVar4);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                *)&local_190,
               &seen_aliases->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,&alias);
    std::__cxx11::string::~string((string *)&import_statement);
  }
  std::__cxx11::string::~string((string *)&alias);
  std::__cxx11::string::~string((string *)&module_name_owned);
  return;
}

Assistant:

void PyiGenerator::PrintImportForDescriptor(
    const FileDescriptor& desc, absl::flat_hash_set<std::string>* seen_aliases,
    bool* has_importlib) const {
  const absl::string_view filename = desc.name();
  std::string module_name_owned = StrippedModuleName(filename);
  absl::string_view module_name(module_name_owned);
  size_t last_dot_pos = module_name.rfind('.');
  std::string alias = absl::StrCat("_", module_name.substr(last_dot_pos + 1));
  // Generate a unique alias by adding _1 suffixes until we get an unused alias.
  while (seen_aliases->find(alias) != seen_aliases->end()) {
    absl::StrAppend(&alias, "_1");
  }
  if (ContainsPythonKeyword(module_name)) {
    if (*has_importlib == false) {
      printer_->Print("import importlib\n");
      *has_importlib = true;
    }
    printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                    alias, "name", module_name);
  } else {
    std::string import_statement;
    if (last_dot_pos == std::string::npos) {
      import_statement = absl::StrCat("import ", module_name);
    } else {
      import_statement =
          absl::StrCat("from ", module_name.substr(0, last_dot_pos), " import ",
                       module_name.substr(last_dot_pos + 1));
    }
    printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                    "alias", alias);
    import_map_[filename] = alias;
    seen_aliases->insert(alias);
  }
}